

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O0

WJTL_STATUS
MakeJson5AndVerify(void *Structure,JlMarshallElement *StructDescription,
                  uint32_t StructDescriptionCount,char *ExpectedJson)

{
  JL_STATUS JVar1;
  int iVar2;
  _Bool _result_2;
  _Bool _result_1;
  char *pcStack_38;
  _Bool _result;
  char *jsonString;
  char *pcStack_28;
  WJTL_STATUS TestReturn;
  char *ExpectedJson_local;
  JlMarshallElement *pJStack_18;
  uint32_t StructDescriptionCount_local;
  JlMarshallElement *StructDescription_local;
  void *Structure_local;
  
  jsonString._4_4_ = WJTL_STATUS_SUCCESS;
  pcStack_38 = (char *)0x0;
  pcStack_28 = ExpectedJson;
  ExpectedJson_local._4_4_ = StructDescriptionCount;
  pJStack_18 = StructDescription;
  StructDescription_local = (JlMarshallElement *)Structure;
  JVar1 = JlStructToJsonEx(Structure,StructDescription,(ulong)StructDescriptionCount,0x2c,
                           &stack0xffffffffffffffc8);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlStructToJsonEx(Structure, StructDescription,StructDescriptionCount, ( ((JL_OUTPUT_FLAGS) 0x4 ) | ((JL_OUTPUT_FLAGS) 0x8 ) | ((JL_OUTPUT_FLAGS) 0x20 ) ), &jsonString ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"MakeJson5AndVerify",0x52);
  if (JVar1 != JL_STATUS_SUCCESS) {
    jsonString._4_4_ = WJTL_STATUS_FAILED;
  }
  if (pcStack_38 != (char *)0x0) {
    iVar2 = strcmp(pcStack_38,pcStack_28);
    WjTestLib_Assert(iVar2 == 0,"strcmp( jsonString, ExpectedJson ) == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                     ,"MakeJson5AndVerify",0x55);
    if (iVar2 != 0) {
      jsonString._4_4_ = WJTL_STATUS_FAILED;
    }
    JVar1 = JlFreeJsonStringBuffer(&stack0xffffffffffffffc8);
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeJsonStringBuffer( &jsonString ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                     ,"MakeJson5AndVerify",0x56);
    if (JVar1 != JL_STATUS_SUCCESS) {
      jsonString._4_4_ = WJTL_STATUS_FAILED;
    }
  }
  return jsonString._4_4_;
}

Assistant:

static
WJTL_STATUS
    MakeJson5AndVerify
    (
        void const*                 Structure,                      // [in]
        JlMarshallElement const*    StructDescription,              // [in]
        uint32_t                    StructDescriptionCount,         // [in]
        char const*                 ExpectedJson                    // [in]
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    char* jsonString = NULL;
    JL_ASSERT_SUCCESS( JlStructToJsonEx(Structure, StructDescription,StructDescriptionCount, JL_OUTPUT_FLAGS_JSON5, &jsonString ) );
    if( NULL != jsonString )
    {
        JL_ASSERT( strcmp( jsonString, ExpectedJson ) == 0 );
        JL_ASSERT_SUCCESS( JlFreeJsonStringBuffer( &jsonString ) );
    }

    return TestReturn;
}